

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O3

void __thiscall gfx::Program::check_validation(Program *this,GLuint shader)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  GLint max_length;
  GLint is_ok;
  string err;
  vector<char,_std::allocator<char>_> info_log;
  GLint local_d0;
  GLint local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<char,_std::allocator<char>_> local_48;
  
  local_cc = 0;
  (*glad_glGetProgramiv)(this->id,0x8b83,&local_cc);
  if (local_cc != 0) {
    return;
  }
  local_d0 = 0;
  (*glad_glGetProgramiv)(this->id,0x8b84,&local_d0);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_48,(long)local_d0,(allocator_type *)&local_68);
  (*glad_glGetProgramInfoLog)
            (this->id,local_d0,(GLsizei *)0x0,
             local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"GLSL validation error for program: ","");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c8,&local_68,&this->name);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_a8 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_a8 == plVar2) {
    local_98 = *plVar2;
    lStack_90 = plVar1[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar2;
  }
  local_a0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_a8);
  local_88 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_88 == plVar2) {
    local_78 = *plVar2;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar2;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_88);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_validation(GLuint shader) {
        GLint is_ok = 0;
        glGetProgramiv(id, GL_VALIDATE_STATUS, &is_ok);
        if (!is_ok) {
			GLint max_length = 0;
            glGetProgramiv(id, GL_INFO_LOG_LENGTH, &max_length);

            // The maxLength includes the NULL character
            std::vector<GLchar> info_log(max_length);
            glGetProgramInfoLog(id, max_length, NULL, &info_log[0]);

            const std::string err = "GLSL validation error for program: ";
            throw std::runtime_error(err + name + "\n" + info_log.data());
		}
    }